

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.cc
# Opt level: O1

VariableIndex __thiscall
cnn::ComputationGraph::add_input
          (ComputationGraph *this,Dim *d,vector<float,_std::allocator<float>_> *pm)

{
  iterator __position;
  InputNode *this_00;
  vector<float,_std::allocator<float>_> *in_RCX;
  InputNode *local_30;
  
  *(int *)&(this->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
           super__Vector_impl_data._M_start =
       (int)((ulong)(*(long *)(d->d + 2) - *(long *)d->d) >> 3);
  this_00 = (InputNode *)operator_new(0x98);
  InputNode::InputNode(this_00,(Dim *)pm,in_RCX);
  __position._M_current = *(Node ***)(d->d + 2);
  local_30 = this_00;
  if (__position._M_current == *(Node ***)(d->d + 4)) {
    std::vector<cnn::Node*,std::allocator<cnn::Node*>>::_M_realloc_insert<cnn::Node*>
              ((vector<cnn::Node*,std::allocator<cnn::Node*>> *)d,__position,(Node **)&local_30);
  }
  else {
    *__position._M_current = (Node *)this_00;
    *(long *)(d->d + 2) = *(long *)(d->d + 2) + 8;
  }
  set_dim_for_new_node((ComputationGraph *)d,(VariableIndex *)this);
  return (VariableIndex)(uint)this;
}

Assistant:

VariableIndex ComputationGraph::add_input(const Dim& d, const vector<float>& pm) {
  VariableIndex new_node_index(nodes.size());
  nodes.push_back(new InputNode(d, pm));
  set_dim_for_new_node(new_node_index);
  return new_node_index;
}